

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O0

int __thiscall Imf_3_2::Image::levelWidth(Image *this,int lx)

{
  int iVar1;
  ostream *poVar2;
  ArgExc *this_00;
  int in_ESI;
  stringstream _iex_throw_s;
  undefined8 in_stack_fffffffffffffe30;
  LevelRoundingMode levelRoundingMode;
  undefined8 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  stringstream local_198 [16];
  ostream local_188 [380];
  int local_c;
  
  levelRoundingMode = (LevelRoundingMode)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  local_c = in_ESI;
  if (-1 < in_ESI) {
    iVar1 = numXLevels((Image *)0x131f32);
    if (in_ESI < iVar1) {
      iVar1 = anon_unknown_8::levelSize
                        (in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                         (int)in_stack_fffffffffffffe38,levelRoundingMode);
      return iVar1;
    }
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_198);
  poVar2 = std::operator<<(local_188,"Cannot get level width for invalid image level number ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c);
  std::operator<<(poVar2,".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(this_00,local_198);
  __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

int
Image::levelWidth (int lx) const
{
    if (lx < 0 || lx >= numXLevels ())
    {
        THROW (
            ArgExc,
            "Cannot get level width for invalid "
            "image level number "
                << lx << ".");
    }

    return levelSize (
        _dataWindow.min.x, _dataWindow.max.x, lx, _levelRoundingMode);
}